

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O3

void __thiscall
coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
ExecutorWrapper(ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
                *this,basic_executor_type<std::allocator<void>,_0UL> *executor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"default","");
  paVar1 = &(this->super_Executor)._name.field_2;
  (this->super_Executor)._name._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = local_30;
    *(undefined8 *)((long)&(this->super_Executor)._name.field_2 + 8) = uStack_28;
  }
  else {
    (this->super_Executor)._name._M_dataplus._M_p = (pointer)local_40;
    (this->super_Executor)._name.field_2._M_allocated_capacity = local_30;
  }
  (this->super_Executor)._name._M_string_length = local_38;
  (this->super_Executor)._vptr_Executor = (_func_int **)&PTR__ExecutorWrapper_001ba6d0;
  (this->executor_).target_ = executor->target_;
  return;
}

Assistant:

ExecutorWrapper(ExecutorImpl executor) : executor_(executor) {}